

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O0

void anon_unknown.dwarf_3cd9::test_add(void **param_1)

{
  roaring64_bitmap_t *b;
  roaring64_bitmap_t *in_RDI;
  roaring64_bitmap_t *unaff_retaddr;
  roaring64_bitmap_t *r;
  roaring64_bitmap_t *in_stack_00000070;
  int in_stack_ffffffffffffffec;
  
  b = roaring64_bitmap_create();
  roaring64_bitmap_add(unaff_retaddr,(uint64_t)in_RDI);
  roaring64_bitmap_add(unaff_retaddr,(uint64_t)in_RDI);
  roaring64_bitmap_add(unaff_retaddr,(uint64_t)in_RDI);
  assert_r64_valid((roaring64_bitmap_t *)b);
  roaring64_bitmap_contains(in_RDI,(uint64_t)b);
  _assert_true((unsigned_long)unaff_retaddr,(char *)in_RDI,(char *)b,in_stack_ffffffffffffffec);
  roaring64_bitmap_contains(in_RDI,(uint64_t)b);
  _assert_true((unsigned_long)unaff_retaddr,(char *)in_RDI,(char *)b,in_stack_ffffffffffffffec);
  roaring64_bitmap_contains(in_RDI,(uint64_t)b);
  _assert_true((unsigned_long)unaff_retaddr,(char *)in_RDI,(char *)b,in_stack_ffffffffffffffec);
  roaring64_bitmap_contains(in_RDI,(uint64_t)b);
  _assert_true((unsigned_long)unaff_retaddr,(char *)in_RDI,(char *)b,in_stack_ffffffffffffffec);
  roaring64_bitmap_free(in_stack_00000070);
  return;
}

Assistant:

DEFINE_TEST(test_add) {
    roaring64_bitmap_t* r = roaring64_bitmap_create();

    roaring64_bitmap_add(r, 0);
    roaring64_bitmap_add(r, 10000);
    roaring64_bitmap_add(r, 200000);

    assert_r64_valid(r);
    assert_true(roaring64_bitmap_contains(r, 0));
    assert_true(roaring64_bitmap_contains(r, 10000));
    assert_true(roaring64_bitmap_contains(r, 200000));

    assert_false(roaring64_bitmap_contains(r, 1));

    roaring64_bitmap_free(r);
}